

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O1

void FM::OPNABase::BuildLFOTable(void)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int c;
  ulong uVar4;
  uint uVar5;
  
  if (amtable == -1) {
    uVar1 = 0xfe;
    uVar2 = 0xffffff00;
    lVar3 = 0;
    uVar4 = 0;
    do {
      uVar5 = uVar2;
      if (uVar4 < 0x80) {
        uVar5 = uVar1;
      }
      *(int *)((long)&pmtable + lVar3) = (int)uVar4;
      *(uint *)((long)&amtable + lVar3) = uVar5 & 0xfffffffc;
      uVar4 = uVar4 + 1;
      uVar1 = uVar1 - 2;
      uVar2 = uVar2 + 2;
      lVar3 = lVar3 + 4;
    } while (uVar4 != 0x100);
  }
  return;
}

Assistant:

void OPNABase::BuildLFOTable()
{
	if (amtable[0] == -1)
	{
		for (int c=0; c<256; c++)
		{
			int v;
			if (c < 0x40)		v = c * 2 + 0x80;
			else if (c < 0xc0)	v = 0x7f - (c - 0x40) * 2 + 0x80;
			else				v = (c - 0xc0) * 2;
			pmtable[c] = c;

			if (c < 0x80)		v = 0xff - c * 2;
			else				v = (c - 0x80) * 2;
			amtable[c] = v & ~3;
		}
	}
}